

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int set_snode_dup_node_check(lyxp_set *set,lys_node *node,lyxp_node_type node_type,int skip_idx)

{
  uint local_2c;
  uint32_t i;
  int skip_idx_local;
  lyxp_node_type node_type_local;
  lys_node *node_local;
  lyxp_set *set_local;
  
  local_2c = 0;
  while( true ) {
    if (set->used <= local_2c) {
      return -1;
    }
    if ((((skip_idx < 0) || (local_2c != skip_idx)) &&
        ((lys_node *)(set->val).nodes[local_2c].node == node)) &&
       ((set->val).nodes[local_2c].type == node_type)) break;
    local_2c = local_2c + 1;
  }
  return local_2c;
}

Assistant:

static int
set_snode_dup_node_check(struct lyxp_set *set, const struct lys_node *node, enum lyxp_node_type node_type, int skip_idx)
{
    uint32_t i;

    for (i = 0; i < set->used; ++i) {
        if ((skip_idx > -1) && (i == (unsigned)skip_idx)) {
            continue;
        }

        if ((set->val.snodes[i].snode == node) && (set->val.snodes[i].type == node_type)) {
            return i;
        }
    }

    return -1;
}